

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_get_max_out_record_payload(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = mbedtls_ssl_get_output_max_frag_len(ssl);
  uVar3 = 0x400;
  if (sVar2 < 0x400) {
    uVar3 = sVar2;
  }
  sVar2 = mbedtls_ssl_get_current_mtu(ssl);
  if (sVar2 != 0) {
    uVar1 = mbedtls_ssl_get_record_expansion(ssl);
    if ((int)uVar1 < 0) {
      uVar3 = (ulong)uVar1;
    }
    else {
      uVar4 = sVar2 - (long)(int)uVar1;
      if (sVar2 < (ulong)(long)(int)uVar1 || uVar4 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0xd56,"MTU too low for record expansion");
        uVar3 = 0xffff8f80;
      }
      else if (uVar4 <= uVar3) {
        uVar3 = uVar4;
      }
    }
  }
  return (int)uVar3;
}

Assistant:

int mbedtls_ssl_get_max_out_record_payload(const mbedtls_ssl_context *ssl)
{
    size_t max_len = MBEDTLS_SSL_OUT_CONTENT_LEN;

#if !defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH) && \
    !defined(MBEDTLS_SSL_PROTO_DTLS)
    (void) ssl;
#endif

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    const size_t mfl = mbedtls_ssl_get_output_max_frag_len(ssl);

    if (max_len > mfl) {
        max_len = mfl;
    }
#endif

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (mbedtls_ssl_get_current_mtu(ssl) != 0) {
        const size_t mtu = mbedtls_ssl_get_current_mtu(ssl);
        const int ret = mbedtls_ssl_get_record_expansion(ssl);
        const size_t overhead = (size_t) ret;

        if (ret < 0) {
            return ret;
        }

        if (mtu <= overhead) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("MTU too low for record expansion"));
            return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
        }

        if (max_len > mtu - overhead) {
            max_len = mtu - overhead;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

#if !defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH) &&        \
    !defined(MBEDTLS_SSL_PROTO_DTLS)
    ((void) ssl);
#endif

    return (int) max_len;
}